

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_client.c
# Opt level: O2

int main(void)

{
  uchar *puVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  char *pcVar7;
  ulong len;
  mbedtls_net_context server_fd;
  ulong local_1118;
  uchar *p;
  uchar hash [32];
  mbedtls_dhm_context dhm;
  mbedtls_rsa_context rsa;
  mbedtls_aes_context aes;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [2048];
  mbedtls_entropy_context entropy;
  
  mbedtls_net_init(&server_fd);
  mbedtls_rsa_init(&rsa,0,6);
  mbedtls_dhm_init(&dhm);
  mbedtls_aes_init(&aes);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  printf("\n  . Seeding the random number generator");
  fflush(_stdout);
  mbedtls_entropy_init(&entropy);
  uVar3 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"dh_client",9);
  if (uVar3 != 0) {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar3);
    goto LAB_00107559;
  }
  printf("\n  . Reading public key from rsa_pub.txt");
  fflush(_stdout);
  __stream = fopen("rsa_pub.txt","rb");
  if (__stream == (FILE *)0x0) {
    pcVar7 = " failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n";
    goto LAB_00107551;
  }
  mbedtls_rsa_init(&rsa,0,0);
  uVar4 = mbedtls_mpi_read_file(&rsa.N,0x10,(FILE *)__stream);
  if (uVar4 == 0) {
    uVar3 = 0x10;
    uVar4 = mbedtls_mpi_read_file(&rsa.E,0x10,(FILE *)__stream);
    if (uVar4 == 0) {
      sVar6 = mbedtls_mpi_bitlen(&rsa.N);
      rsa.len = sVar6 + 7 >> 3;
      fclose(__stream);
      printf("\n  . Connecting to tcp/%s/%s","localhost","11999");
      fflush(_stdout);
      uVar4 = mbedtls_net_connect(&server_fd,"localhost","11999",0);
      if (uVar4 != 0) {
        pcVar7 = " failed\n  ! mbedtls_net_connect returned %d\n\n";
        goto LAB_00107952;
      }
      printf("\n  . Receiving the server\'s DH parameters");
      fflush(_stdout);
      memset(buf,0,0x800);
      uVar4 = mbedtls_net_recv(&server_fd,buf,2);
      if (uVar4 == 2) {
        uVar2 = buf._0_2_ << 8 | (ushort)buf._0_2_ >> 8;
        len = (ulong)uVar2;
        local_1118 = len;
        if (len - 0x801 < 0xfffffffffffff800) {
          puts(" failed\n  ! Got an invalid buffer length\n");
          uVar3 = 2;
          goto LAB_00107559;
        }
        memset(buf,0,0x800);
        uVar4 = mbedtls_net_recv(&server_fd,buf,len);
        if (uVar4 != uVar2) goto LAB_00107949;
        p = buf;
        uVar4 = mbedtls_dhm_read_params(&dhm,&p,buf + len);
        if (uVar4 == 0) {
          if (dhm.len - 0x201 < 0xfffffffffffffe3f) {
            pcVar7 = " failed\n  ! Invalid DHM modulus size\n";
          }
          else {
            printf("\n  . Verifying the server\'s RSA signature");
            fflush(_stdout);
            puVar1 = p + 2;
            local_1118 = (long)(buf + len) - (long)puVar1;
            if (local_1118 == rsa.len) {
              iVar5 = (int)p;
              p = puVar1;
              mbedtls_sha1(buf,(long)(iVar5 - (int)buf),hash);
              uVar4 = mbedtls_rsa_pkcs1_verify
                                (&rsa,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,
                                 MBEDTLS_MD_SHA256,0,hash,p);
              if (uVar4 == 0) {
                printf("\n  . Sending own public value to server");
                fflush(_stdout);
                local_1118 = dhm.len;
                uVar4 = mbedtls_dhm_make_public
                                  (&dhm,(uint)dhm.len,buf,dhm.len,mbedtls_ctr_drbg_random,&ctr_drbg)
                ;
                if (uVar4 == 0) {
                  uVar4 = mbedtls_net_send(&server_fd,buf,dhm.len);
                  if (uVar4 == (uint)dhm.len) {
                    printf("\n  . Shared secret: ");
                    fflush(_stdout);
                    uVar4 = mbedtls_dhm_calc_secret
                                      (&dhm,buf,0x800,&local_1118,mbedtls_ctr_drbg_random,&ctr_drbg)
                    ;
                    if (uVar4 == 0) {
                      for (local_1118 = 0; local_1118 < 0x10; local_1118 = local_1118 + 1) {
                        printf("%02x",(ulong)buf[local_1118]);
                      }
                      printf("...\n  . Receiving and decrypting the ciphertext");
                      fflush(_stdout);
                      mbedtls_aes_setkey_dec(&aes,buf,0x100);
                      memset(buf,0,0x800);
                      uVar4 = mbedtls_net_recv(&server_fd,buf,0x10);
                      if (uVar4 == 0x10) {
                        mbedtls_aes_crypt_ecb(&aes,0,buf,buf);
                        buf[0x10] = '\0';
                        printf("\n  . Plaintext is \"%s\"\n\n",buf);
                        goto LAB_00107559;
                      }
                      goto LAB_00107949;
                    }
                    pcVar7 = " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n";
                  }
                  else {
                    pcVar7 = " failed\n  ! mbedtls_net_send returned %d\n\n";
                  }
                }
                else {
                  pcVar7 = " failed\n  ! mbedtls_dhm_make_public returned %d\n\n";
                }
              }
              else {
                pcVar7 = " failed\n  ! mbedtls_rsa_pkcs1_verify returned %d\n\n";
              }
              goto LAB_00107952;
            }
            pcVar7 = " failed\n  ! Invalid RSA signature size\n";
            p = puVar1;
          }
LAB_00107551:
          puts(pcVar7);
          uVar3 = 1;
          goto LAB_00107559;
        }
        pcVar7 = " failed\n  ! mbedtls_dhm_read_params returned %d\n\n";
      }
      else {
LAB_00107949:
        pcVar7 = " failed\n  ! mbedtls_net_recv returned %d\n\n";
      }
LAB_00107952:
      printf(pcVar7,(ulong)uVar4);
      uVar3 = uVar4;
      goto LAB_00107559;
    }
  }
  printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar4);
  fclose(__stream);
  uVar3 = uVar4;
LAB_00107559:
  mbedtls_net_free(&server_fd);
  mbedtls_aes_free(&aes);
  mbedtls_rsa_free(&rsa);
  mbedtls_dhm_free(&dhm);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return uVar3;
}

Assistant:

int main( void )
{
    FILE *f;

    int ret;
    size_t n, buflen;
    mbedtls_net_context server_fd;

    unsigned char *p, *end;
    unsigned char buf[2048];
    unsigned char hash[32];
    const char *pers = "dh_client";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_rsa_context rsa;
    mbedtls_dhm_context dhm;
    mbedtls_aes_context aes;

    mbedtls_net_init( &server_fd );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, MBEDTLS_MD_SHA256 );
    mbedtls_dhm_init( &dhm );
    mbedtls_aes_init( &aes );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 1. Setup the RNG
     */
    mbedtls_printf( "\n  . Seeding the random number generator" );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    /*
     * 2. Read the server's public RSA key
     */
    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * 3. Initiate the connection
     */
    mbedtls_printf( "\n  . Connecting to tcp/%s/%s", SERVER_NAME,
                                             SERVER_PORT );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, SERVER_NAME,
                                         SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 4a. First get the buffer length
     */
    mbedtls_printf( "\n  . Receiving the server's DH parameters" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, 2 ) ) != 2 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    n = buflen = ( buf[0] << 8 ) | buf[1];
    if( buflen < 1 || buflen > sizeof( buf ) )
    {
        mbedtls_printf( " failed\n  ! Got an invalid buffer length\n\n" );
        goto exit;
    }

    /*
     * 4b. Get the DHM parameters: P, G and Ys = G^Xs mod P
     */
    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    p = buf, end = buf + buflen;

    if( ( ret = mbedtls_dhm_read_params( &dhm, &p, end ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_read_params returned %d\n\n", ret );
        goto exit;
    }

    if( dhm.len < 64 || dhm.len > 512 )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Invalid DHM modulus size\n\n" );
        goto exit;
    }

    /*
     * 5. Check that the server's RSA signature matches
     *    the SHA-256 hash of (P,G,Ys)
     */
    mbedtls_printf( "\n  . Verifying the server's RSA signature" );
    fflush( stdout );

    p += 2;

    if( ( n = (size_t) ( end - p ) ) != rsa.len )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Invalid RSA signature size\n\n" );
        goto exit;
    }

    mbedtls_sha1( buf, (int)( p - 2 - buf ), hash );

    if( ( ret = mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL, MBEDTLS_RSA_PUBLIC,
                                  MBEDTLS_MD_SHA256, 0, hash, p ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_verify returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 6. Send our public value: Yc = G ^ Xc mod P
     */
    mbedtls_printf( "\n  . Sending own public value to server" );
    fflush( stdout );

    n = dhm.len;
    if( ( ret = mbedtls_dhm_make_public( &dhm, (int) dhm.len, buf, n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_make_public returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_net_send( &server_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 7. Derive the shared secret: K = Ys ^ Xc mod P
     */
    mbedtls_printf( "\n  . Shared secret: " );
    fflush( stdout );

    if( ( ret = mbedtls_dhm_calc_secret( &dhm, buf, sizeof( buf ), &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n", ret );
        goto exit;
    }

    for( n = 0; n < 16; n++ )
        mbedtls_printf( "%02x", buf[n] );

    /*
     * 8. Setup the AES-256 decryption key
     *
     * This is an overly simplified example; best practice is
     * to hash the shared secret with a random value to derive
     * the keying material for the encryption/decryption keys,
     * IVs and MACs.
     */
    mbedtls_printf( "...\n  . Receiving and decrypting the ciphertext" );
    fflush( stdout );

    mbedtls_aes_setkey_dec( &aes, buf, 256 );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, 16 ) ) != 16 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_aes_crypt_ecb( &aes, MBEDTLS_AES_DECRYPT, buf, buf );
    buf[16] = '\0';
    mbedtls_printf( "\n  . Plaintext is \"%s\"\n\n", (char *) buf );

exit:

    mbedtls_net_free( &server_fd );

    mbedtls_aes_free( &aes );
    mbedtls_rsa_free( &rsa );
    mbedtls_dhm_free( &dhm );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}